

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

int __thiscall
Lib::DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  Entry EVar1;
  Entry *e;
  int iVar2;
  DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar3;
  Entry local_50;
  IndexType local_3c;
  pair<Indexing::IndexType,_Indexing::IndexManager::Entry> local_38;
  Entry *local_20;
  char *local_10;
  DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_8;
  
  pDVar3 = this;
  local_10 = __filename;
  local_8 = this;
  local_20 = findEntry(this,&this->_timestamp);
  iVar2 = (int)pDVar3;
  if (local_20 == (Entry *)0x0) {
    memset(this,0,0x20);
    Option<std::pair<Indexing::IndexType,_Indexing::IndexManager::Entry>_>::Option
              ((Option<std::pair<Indexing::IndexType,_Indexing::IndexManager::Entry>_> *)0x368869);
  }
  else {
    (local_20->field_0)._infoData = (local_20->field_0)._infoData & 0xfffffffeU | 1;
    *(int *)(__filename + 4) = *(int *)(__filename + 4) + -1;
    *(int *)(__filename + 8) = *(int *)(__filename + 8) + 1;
    local_3c = move_if_value<Indexing::IndexType,_true>(&local_20->_key);
    EVar1 = move_if_value<Indexing::IndexManager::Entry,_true>(&local_20->_val);
    local_50.index = EVar1.index;
    local_50.refCnt = EVar1.refCnt;
    std::pair<Indexing::IndexType,_Indexing::IndexManager::Entry>::
    pair<Indexing::IndexType,_Indexing::IndexManager::Entry,_true>(&local_38,&local_3c,&local_50);
    some<std::pair<Indexing::IndexType,Indexing::IndexManager::Entry>>
              ((pair<Indexing::IndexType,_Indexing::IndexManager::Entry> *)this);
  }
  return iVar2;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }